

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O2

Vec3fa __thiscall
embree::VelvetMaterial__eval
          (embree *this,ISPCVelvetMaterial *This,BRDF *brdf,Vec3fa *wo,DifferentialGeometry *dg,
          Vec3fa *wi)

{
  Vec3fa VVar1;
  Minneart minneart;
  Velvety velvety;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_148;
  float local_138;
  Velvety local_128;
  
  local_148._0_8_ = *(undefined8 *)&(This->reflectance).field_0;
  local_148._8_8_ = *(undefined8 *)((long)&(This->reflectance).field_0 + 8);
  local_138 = This->backScattering;
  local_128.R.field_0._0_8_ = *(undefined8 *)&(This->horizonScatteringColor).field_0;
  local_128.R.field_0._8_8_ = *(undefined8 *)((long)&(This->horizonScatteringColor).field_0 + 8);
  local_128.f = This->horizonScatteringFallOff;
  Minneart__eval((embree *)&local_168,(Minneart *)&local_148.field_1,wo,dg,wi);
  VVar1 = Velvety__eval((embree *)&local_158,&local_128,wo,dg,wi);
  VVar1.field_0._0_4_ = local_168 + local_158;
  VVar1.field_0._4_4_ = fStack_164 + fStack_154;
  *(float *)this = VVar1.field_0._0_4_;
  *(float *)(this + 4) = VVar1.field_0._4_4_;
  *(float *)(this + 8) = fStack_160 + fStack_150;
  *(float *)(this + 0xc) = fStack_15c + fStack_14c;
  return (Vec3fa)VVar1.field_0;
}

Assistant:

Vec3fa VelvetMaterial__eval(ISPCVelvetMaterial* This, const BRDF& brdf, const Vec3fa& wo, const DifferentialGeometry& dg, const Vec3fa& wi)
{
  Minneart minneart; Minneart__Constructor(&minneart,(Vec3fa)Vec3fa(This->reflectance),This->backScattering);
  Velvety velvety; Velvety__Constructor (&velvety,Vec3fa((Vec3fa)This->horizonScatteringColor),This->horizonScatteringFallOff);
  return Minneart__eval(&minneart,wo,dg,wi) + Velvety__eval(&velvety,wo,dg,wi);
}